

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::SocketTest_UdpSocketHello_Test::TestBody(SocketTest_UdpSocketHello_Test *this)

{
  long *plVar1;
  undefined8 *puVar2;
  event_base *peVar3;
  uint16_t uVar4;
  int iVar5;
  pointer *__ptr;
  eventop *peVar6;
  char *pcVar7;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  AssertionResult gtest_ar_3;
  event_base *eventBase;
  ByteArray kHello;
  UdpSocket clientSocket;
  ByteArray kWorld;
  UdpSocket serverSocket;
  AssertHelper local_238;
  AssertHelper local_230;
  AssertHelper local_228;
  undefined8 *local_220;
  event_base *local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_210;
  _Any_data local_1f8;
  code *local_1e8;
  code *pcStack_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *pcStack_1c0;
  UdpSocket local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  UdpSocket local_e0;
  
  local_e0.super_Socket._vptr_Socket._0_4_ = 0x6c6c6568;
  local_e0.super_Socket._vptr_Socket._4_1_ = 0x6f;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_210,__l,(allocator_type *)&local_1b8);
  local_e0.super_Socket._vptr_Socket._0_4_ = 0x6c726f77;
  local_e0.super_Socket._vptr_Socket._4_1_ = 100;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_e0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_f8,__l_00,(allocator_type *)&local_1b8);
  local_218 = event_base_new();
  local_1b8.super_Socket._vptr_Socket = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&local_e0,"eventBase","nullptr",&local_218,(void **)&local_1b8);
  if ((char)local_e0.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&local_1b8);
    if (local_e0.super_Socket.mEventBase == (event_base *)0x0) {
      peVar6 = (eventop *)(anon_var_dwarf_434f87 + 9);
    }
    else {
      peVar6 = (local_e0.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xa1,(char *)peVar6);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if (local_1b8.super_Socket._vptr_Socket != (_func_int **)0x0) {
      (**(code **)(*local_1b8.super_Socket._vptr_Socket + 8))();
    }
  }
  if (local_e0.super_Socket.mEventBase != (event_base *)0x0) {
    if ((local_e0.super_Socket.mEventBase)->evsel !=
        (eventop *)&(local_e0.super_Socket.mEventBase)->changelist) {
      operator_delete((local_e0.super_Socket.mEventBase)->evsel);
    }
    operator_delete(local_e0.super_Socket.mEventBase);
  }
  UdpSocket::UdpSocket(&local_e0,local_218);
  local_1c8 = (code *)0x0;
  pcStack_1c0 = (code *)0x0;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1d8._M_unused._M_object = operator_new(0x18);
  *(UdpSocket **)local_1d8._M_unused._0_8_ = &local_e0;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)((long)local_1d8._M_unused._0_8_ + 8) =
       &local_210;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
   ((long)local_1d8._M_unused._0_8_ + 0x10) = &local_f8;
  pcStack_1c0 = std::
                _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:164:34)>
                ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:164:34)>
              ::_M_manager;
  UdpSocket::SetEventHandler(&local_e0,(EventHandler *)&local_1d8);
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  iVar5 = UdpSocket::Bind(&local_e0,(string *)kServerAddr_abi_cxx11_,kServerPort);
  local_228.data_._0_1_ = SUB41(iVar5,0);
  local_228.data_._1_1_ = (undefined1)((uint)iVar5 >> 8);
  local_228.data_._2_2_ = (undefined2)((uint)iVar5 >> 0x10);
  local_238.data_ = (AssertHelperData *)((ulong)local_238.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_1b8,"serverSocket.Bind(kServerAddr, kServerPort)","0",
             (int *)&local_228,(int *)&local_238);
  if ((char)local_1b8.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&local_228);
    if (local_1b8.super_Socket.mEventBase == (event_base *)0x0) {
      peVar6 = (eventop *)(anon_var_dwarf_434f87 + 9);
    }
    else {
      peVar6 = (local_1b8.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xb4,(char *)peVar6);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    plVar1 = (long *)CONCAT44(local_228.data_._4_4_,
                              CONCAT22(local_228.data_._2_2_,
                                       CONCAT11(local_228.data_._1_1_,local_228.data_._0_1_)));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  peVar3 = local_1b8.super_Socket.mEventBase;
  if (local_1b8.super_Socket.mEventBase != (event_base *)0x0) {
    if ((local_1b8.super_Socket.mEventBase)->evsel !=
        (eventop *)&(local_1b8.super_Socket.mEventBase)->changelist) {
      operator_delete((local_1b8.super_Socket.mEventBase)->evsel);
    }
    operator_delete(peVar3);
  }
  uVar4 = UdpSocket::GetLocalPort(&local_e0);
  local_228.data_._0_1_ = SUB21(uVar4,0);
  local_228.data_._1_1_ = (undefined1)(uVar4 >> 8);
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&local_1b8,"serverSocket.GetLocalPort()","kServerPort",
             (unsigned_short *)&local_228,&kServerPort);
  if ((char)local_1b8.super_Socket._vptr_Socket == '\0') {
    testing::Message::Message((Message *)&local_228);
    if (local_1b8.super_Socket.mEventBase == (event_base *)0x0) {
      peVar6 = (eventop *)(anon_var_dwarf_434f87 + 9);
    }
    else {
      peVar6 = (local_1b8.super_Socket.mEventBase)->evsel;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xb5,(char *)peVar6);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    plVar1 = (long *)CONCAT44(local_228.data_._4_4_,
                              CONCAT22(local_228.data_._2_2_,
                                       CONCAT11(local_228.data_._1_1_,local_228.data_._0_1_)));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  if (local_1b8.super_Socket.mEventBase != (event_base *)0x0) {
    if ((local_1b8.super_Socket.mEventBase)->evsel !=
        (eventop *)&(local_1b8.super_Socket.mEventBase)->changelist) {
      operator_delete((local_1b8.super_Socket.mEventBase)->evsel);
    }
    operator_delete(local_1b8.super_Socket.mEventBase);
  }
  UdpSocket::UdpSocket(&local_1b8,local_218);
  local_1e8 = (code *)0x0;
  pcStack_1e0 = (code *)0x0;
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1f8._M_unused._M_object = operator_new(0x18);
  *(UdpSocket **)local_1f8._M_unused._0_8_ = &local_1b8;
  *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)((long)local_1f8._M_unused._0_8_ + 8) =
       &local_f8;
  *(event_base ***)((long)local_1f8._M_unused._0_8_ + 0x10) = &local_218;
  pcStack_1e0 = std::
                _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:184:34)>
                ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp:184:34)>
              ::_M_manager;
  UdpSocket::SetEventHandler(&local_1b8,(EventHandler *)&local_1f8);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  iVar5 = UdpSocket::Connect(&local_1b8,(string *)kServerAddr_abi_cxx11_,kServerPort);
  local_238.data_._0_4_ = iVar5;
  local_230.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"clientSocket.Connect(kServerAddr, kServerPort)","0",
             (int *)&local_238,(int *)&local_230);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_220 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_220;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc5,pcVar7);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  puVar2 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar2);
  }
  uVar4 = UdpSocket::GetPeerPort(&local_1b8);
  local_238.data_._0_2_ = uVar4;
  testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
            ((internal *)&local_228,"clientSocket.GetPeerPort()","kServerPort",
             (unsigned_short *)&local_238,&kServerPort);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_220 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_220;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  puVar2 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar2);
  }
  local_230.data_._0_4_ =
       UdpSocket::Send(&local_1b8,
                       local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)local_210.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_210.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
  local_238.data_ =
       (AssertHelperData *)
       (local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
       -(long)local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&local_228,"clientSocket.Send(&kHello[0], kHello.size())","kHello.size()",
             (int *)&local_230,(unsigned_long *)&local_238);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_220 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_220;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,199,pcVar7);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  puVar2 = local_220;
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(puVar2);
  }
  iVar5 = event_base_loop(local_218,4);
  local_238.data_._0_4_ = iVar5;
  local_230.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_228,"event_base_loop(eventBase, 0x04)","0",(int *)&local_238,
             (int *)&local_230);
  if (local_228.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_220 == (undefined8 *)0x0) {
      pcVar7 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar7 = (char *)*local_220;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket_test.cpp"
               ,0xc9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    if (local_238.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_238.data_ + 8))();
    }
  }
  if (local_220 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_220 != local_220 + 2) {
      operator_delete((undefined8 *)*local_220);
    }
    operator_delete(local_220);
  }
  event_base_free(local_218);
  UdpSocket::~UdpSocket(&local_1b8);
  UdpSocket::~UdpSocket(&local_e0);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_210.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SocketTest, UdpSocketHello)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};
    const ByteArray kWorld{'w', 'o', 'r', 'l', 'd'};

    auto eventBase = event_base_new();
    EXPECT_NE(eventBase, nullptr);

    UdpSocket serverSocket{eventBase};
    serverSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

        if (aFlags & EV_READ)
        {
            len = serverSocket.Receive(buf, sizeof(buf));
            EXPECT_GT(len, 0);
            EXPECT_EQ((ByteArray{buf, buf + len}), kHello);

            len = serverSocket.Send(&kWorld[0], kWorld.size());
            EXPECT_EQ(static_cast<size_t>(len), kWorld.size());
        }
    });
    EXPECT_EQ(serverSocket.Bind(kServerAddr, kServerPort), 0);
    EXPECT_EQ(serverSocket.GetLocalPort(), kServerPort);

    UdpSocket clientSocket{eventBase};
    clientSocket.SetEventHandler([&](short aFlags) {
        uint8_t buf[1024];
        int     len;

        if (aFlags & EV_READ)
        {
            len = clientSocket.Receive(buf, sizeof(buf));
            EXPECT_EQ((ByteArray{buf, buf + len}), kWorld);

            event_base_loopbreak(eventBase);
        }
    });

    EXPECT_EQ(clientSocket.Connect(kServerAddr, kServerPort), 0);
    EXPECT_EQ(clientSocket.GetPeerPort(), kServerPort);
    EXPECT_EQ(clientSocket.Send(&kHello[0], kHello.size()), kHello.size());

    EXPECT_EQ(event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY), 0);
    event_base_free(eventBase);
}